

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O3

void lowbd_fwd_txfm2d_8x16_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  byte bVar1;
  code *pcVar2;
  code *pcVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  uint uVar15;
  undefined8 uVar16;
  bool bVar17;
  int8_t *piVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint uVar21;
  undefined7 in_register_00000009;
  undefined8 *puVar22;
  long lVar23;
  undefined8 *puVar24;
  undefined8 *puVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  __m128i buf0 [16];
  __m256i buf2 [8];
  __m128i buf1 [16];
  undefined8 auStack_390 [2];
  undefined8 local_380 [4];
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined1 local_250 [16];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined1 local_220 [16];
  undefined8 local_210;
  undefined8 uStack_208;
  undefined1 local_200 [16];
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [16];
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [16];
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [16];
  undefined8 local_190;
  undefined8 uStack_188;
  undefined1 local_180 [16];
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160 [4];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  
  piVar18 = av1_fwd_txfm_shift_ls[7];
  uVar15 = (uint)CONCAT71(in_register_00000009,tx_type);
  bVar17 = false;
  if (uVar15 < 0x10) {
    if ((0x4110U >> (uVar15 & 0x1f) & 1) != 0) {
LAB_004726d0:
      lVar23 = 0x100;
      do {
        uVar16 = *(undefined8 *)(input + 4);
        *(undefined8 *)((long)auStack_390 + lVar23) = *(undefined8 *)input;
        *(undefined8 *)((long)auStack_390 + lVar23 + 8) = uVar16;
        input = input + stride;
        lVar23 = lVar23 + -0x10;
      } while (lVar23 != 0);
      goto LAB_004726ee;
    }
    if ((0x80a0U >> (uVar15 & 0x1f) & 1) == 0) {
      if (uVar15 == 6) {
        bVar17 = true;
        goto LAB_004726d0;
      }
    }
    else {
      bVar17 = true;
    }
  }
  lVar23 = 0;
  do {
    uVar16 = *(undefined8 *)(input + 4);
    *(undefined8 *)((long)local_380 + lVar23) = *(undefined8 *)input;
    *(undefined8 *)((long)local_380 + lVar23 + 8) = uVar16;
    lVar23 = lVar23 + 0x10;
    input = input + stride;
  } while (lVar23 != 0x100);
LAB_004726ee:
  pcVar2 = *(code **)((long)col_txfm8x16_arr + (ulong)(uVar15 * 8));
  bVar1 = *av1_fwd_txfm_shift_ls[7];
  uVar21 = (uint)(char)bVar1;
  if ((int)uVar21 < 0) {
    auVar26._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
    auVar26._2_2_ = auVar26._0_2_;
    auVar26._4_2_ = auVar26._0_2_;
    auVar26._6_2_ = auVar26._0_2_;
    auVar26._8_2_ = auVar26._0_2_;
    auVar26._10_2_ = auVar26._0_2_;
    auVar26._12_2_ = auVar26._0_2_;
    auVar26._14_2_ = auVar26._0_2_;
    lVar23 = 0;
    do {
      auVar27 = vpaddsw_avx(auVar26,*(undefined1 (*) [16])((long)local_380 + lVar23));
      auVar27 = vpsraw_avx(auVar27,ZEXT416(-uVar21));
      *(undefined1 (*) [16])((long)local_380 + lVar23) = auVar27;
      lVar23 = lVar23 + 0x10;
    } while (lVar23 != 0x100);
  }
  else if (bVar1 != 0) {
    lVar23 = 0;
    do {
      auVar26 = vpsllw_avx(*(undefined1 (*) [16])((long)local_380 + lVar23),ZEXT416(uVar21));
      *(undefined1 (*) [16])((long)local_380 + lVar23) = auVar26;
      lVar23 = lVar23 + 0x10;
    } while (lVar23 != 0x100);
  }
  pcVar3 = *(code **)((long)row_txfm8x16_arr + (ulong)(uVar15 * 8));
  auStack_390[1] = 0x472778;
  (*pcVar2)(local_380,local_380,0xd);
  bVar1 = piVar18[1];
  if ((char)bVar1 < '\0') {
    auVar27._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
    auVar27._2_2_ = auVar27._0_2_;
    auVar27._4_2_ = auVar27._0_2_;
    auVar27._6_2_ = auVar27._0_2_;
    auVar27._8_2_ = auVar27._0_2_;
    auVar27._10_2_ = auVar27._0_2_;
    auVar27._12_2_ = auVar27._0_2_;
    auVar27._14_2_ = auVar27._0_2_;
    lVar23 = 0;
    do {
      auVar26 = vpaddsw_avx(auVar27,*(undefined1 (*) [16])((long)local_380 + lVar23));
      auVar26 = vpsraw_avx(auVar26,ZEXT416((uint)-(int)(char)bVar1));
      *(undefined1 (*) [16])((long)local_380 + lVar23) = auVar26;
      lVar23 = lVar23 + 0x10;
    } while (lVar23 != 0x100);
  }
  else if (bVar1 != 0) {
    lVar23 = 0;
    do {
      auVar26 = vpsllw_avx(*(undefined1 (*) [16])((long)local_380 + lVar23),
                           ZEXT416((uint)(int)(char)bVar1));
      *(undefined1 (*) [16])((long)local_380 + lVar23) = auVar26;
      lVar23 = lVar23 + 0x10;
    } while (lVar23 != 0x100);
  }
  auVar4._8_8_ = local_380[1];
  auVar4._0_8_ = local_380[0];
  auVar5._8_8_ = local_380[3];
  auVar5._0_8_ = local_380[2];
  auVar6 = vpunpcklwd_avx(auVar4,auVar5);
  auVar7 = vpunpcklwd_avx(local_360,local_350);
  auVar8 = vpunpcklwd_avx(local_340,local_330);
  auVar9 = vpunpcklwd_avx(local_320,local_310);
  auVar26 = vpunpckhwd_avx(auVar4,auVar5);
  auVar27 = vpunpckhwd_avx(local_360,local_350);
  auVar4 = vpunpckhwd_avx(local_340,local_330);
  auVar5 = vpunpckhwd_avx(local_320,local_310);
  auVar10 = vpunpckldq_avx(auVar6,auVar7);
  auVar11 = vpunpckldq_avx(auVar8,auVar9);
  auVar12 = vpunpckldq_avx(auVar26,auVar27);
  auVar13 = vpunpckldq_avx(auVar4,auVar5);
  auVar6 = vpunpckhdq_avx(auVar6,auVar7);
  auVar7 = vpunpckhdq_avx(auVar8,auVar9);
  auVar26 = vpunpckhdq_avx(auVar26,auVar27);
  auVar27 = vpunpckhdq_avx(auVar4,auVar5);
  local_270 = vpunpcklqdq_avx(auVar10,auVar11);
  auVar20 = local_270;
  local_280 = vpunpckhqdq_avx(auVar10,auVar11);
  auVar19 = local_280;
  local_140 = vpunpcklqdq_avx(auVar6,auVar7);
  local_130 = vpunpckhqdq_avx(auVar6,auVar7);
  local_120 = vpunpcklqdq_avx(auVar12,auVar13);
  local_110 = vpunpckhqdq_avx(auVar12,auVar13);
  local_100 = vpunpcklqdq_avx(auVar26,auVar27);
  local_f0 = vpunpckhqdq_avx(auVar26,auVar27);
  auVar6 = vpunpcklwd_avx(local_300,local_2f0);
  auVar7 = vpunpcklwd_avx(local_2e0,local_2d0);
  auVar26 = vpunpckhwd_avx(local_300,local_2f0);
  auVar8 = vpunpcklwd_avx(local_2c0,local_2b0);
  auVar27 = vpunpckhwd_avx(local_2e0,local_2d0);
  auVar4 = vpunpckhwd_avx(local_2c0,local_2b0);
  auVar9 = vpunpcklwd_avx(local_2a0,local_290);
  auVar5 = vpunpckhwd_avx(local_2a0,local_290);
  auVar10 = vpunpckldq_avx(auVar6,auVar7);
  auVar6 = vpunpckhdq_avx(auVar6,auVar7);
  auVar11 = vpunpckldq_avx(auVar8,auVar9);
  auVar7 = vpunpckhdq_avx(auVar8,auVar9);
  auVar8 = vpunpckldq_avx(auVar26,auVar27);
  auVar26 = vpunpckhdq_avx(auVar26,auVar27);
  auVar9 = vpunpckldq_avx(auVar4,auVar5);
  auVar27 = vpunpckhdq_avx(auVar4,auVar5);
  local_e0 = vpunpcklqdq_avx(auVar10,auVar11);
  local_d0 = vpunpckhqdq_avx(auVar10,auVar11);
  puVar24 = local_160;
  local_160[0] = local_270._0_8_;
  local_160[1] = local_270._8_8_;
  local_160[2] = local_280._0_8_;
  local_160[3] = local_280._8_8_;
  local_c0 = vpunpcklqdq_avx(auVar6,auVar7);
  local_b0 = vpunpckhqdq_avx(auVar6,auVar7);
  local_a0 = vpunpcklqdq_avx(auVar8,auVar9);
  local_90 = vpunpckhqdq_avx(auVar8,auVar9);
  local_80 = vpunpcklqdq_avx(auVar26,auVar27);
  local_70 = vpunpckhqdq_avx(auVar26,auVar27);
  lVar23 = 0x80;
  puVar22 = (undefined8 *)local_e0;
  puVar25 = puVar22;
  local_200 = local_130;
  local_220 = local_140;
  local_180 = local_f0;
  local_1a0 = local_100;
  local_1c0 = local_110;
  local_1e0 = local_120;
  local_250 = local_e0;
  local_240 = local_280._0_8_;
  uStack_238 = local_280._8_8_;
  local_280 = auVar19;
  if (bVar17) {
    puVar25 = (undefined8 *)local_300;
    do {
      uVar16 = puVar24[1];
      *(undefined8 *)((long)auStack_390 + lVar23) = *puVar24;
      *(undefined8 *)((long)auStack_390 + lVar23 + 8) = uVar16;
      puVar24 = puVar24 + 2;
      lVar23 = lVar23 + -0x10;
    } while (lVar23 != 0);
    lVar23 = 0x80;
    do {
      uVar16 = puVar22[1];
      *(undefined8 *)(local_310 + lVar23) = *puVar22;
      *(undefined8 *)(local_310 + lVar23 + 8) = uVar16;
      puVar22 = puVar22 + 2;
      lVar23 = lVar23 + -0x10;
      local_200 = local_350;
      local_220 = local_360;
      local_180 = local_310;
      local_1a0 = local_320;
      local_1c0 = local_330;
      local_1e0 = local_340;
      local_250 = local_300;
      local_270._0_8_ = local_380[0];
      local_270._8_8_ = local_380[1];
      local_240 = local_380[2];
      uStack_238 = local_380[3];
    } while (lVar23 != 0);
  }
  local_260 = local_270._0_8_;
  uStack_258 = local_270._8_8_;
  local_230 = puVar25[2];
  uStack_228 = puVar25[3];
  local_210 = puVar25[4];
  uStack_208 = puVar25[5];
  local_1f0 = puVar25[6];
  uStack_1e8 = puVar25[7];
  local_1d0 = puVar25[8];
  uStack_1c8 = puVar25[9];
  local_1b0 = puVar25[10];
  uStack_1a8 = puVar25[0xb];
  local_190 = puVar25[0xc];
  uStack_188 = puVar25[0xd];
  local_170 = puVar25[0xe];
  uStack_168 = puVar25[0xf];
  auStack_390[1] = 0x472ae8;
  local_270 = auVar20;
  (*pcVar3)(&local_260,&local_260,0xd);
  bVar1 = piVar18[2];
  if ((char)bVar1 < '\0') {
    auVar30._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
    auVar30._2_2_ = auVar30._0_2_;
    auVar30._4_2_ = auVar30._0_2_;
    auVar30._6_2_ = auVar30._0_2_;
    auVar30._8_2_ = auVar30._0_2_;
    auVar30._10_2_ = auVar30._0_2_;
    auVar30._12_2_ = auVar30._0_2_;
    auVar30._14_2_ = auVar30._0_2_;
    auVar30._16_2_ = auVar30._0_2_;
    auVar30._18_2_ = auVar30._0_2_;
    auVar30._20_2_ = auVar30._0_2_;
    auVar30._22_2_ = auVar30._0_2_;
    auVar30._24_2_ = auVar30._0_2_;
    auVar30._26_2_ = auVar30._0_2_;
    auVar30._28_2_ = auVar30._0_2_;
    auVar30._30_2_ = auVar30._0_2_;
    lVar23 = 0;
    do {
      auVar28 = vpaddsw_avx2(auVar30,*(undefined1 (*) [32])((long)&local_260 + lVar23));
      auVar28 = vpsraw_avx2(auVar28,ZEXT416((uint)-(int)(char)bVar1));
      *(undefined1 (*) [32])((long)&local_260 + lVar23) = auVar28;
      lVar23 = lVar23 + 0x20;
    } while (lVar23 != 0x100);
  }
  else if (bVar1 != 0) {
    lVar23 = 0;
    do {
      auVar30 = vpsllw_avx2(*(undefined1 (*) [32])((long)&local_260 + lVar23),
                            ZEXT416((uint)(int)(char)bVar1));
      *(undefined1 (*) [32])((long)&local_260 + lVar23) = auVar30;
      lVar23 = lVar23 + 0x20;
    } while (lVar23 != 0x100);
  }
  lVar23 = 0;
  auVar28._8_2_ = 1;
  auVar28._0_8_ = 0x1000100010001;
  auVar28._10_2_ = 1;
  auVar28._12_2_ = 1;
  auVar28._14_2_ = 1;
  auVar28._16_2_ = 1;
  auVar28._18_2_ = 1;
  auVar28._20_2_ = 1;
  auVar28._22_2_ = 1;
  auVar28._24_2_ = 1;
  auVar28._26_2_ = 1;
  auVar28._28_2_ = 1;
  auVar28._30_2_ = 1;
  auVar29._8_4_ = 0x80016a1;
  auVar29._0_8_ = 0x80016a1080016a1;
  auVar29._12_4_ = 0x80016a1;
  auVar29._16_4_ = 0x80016a1;
  auVar29._20_4_ = 0x80016a1;
  auVar29._24_4_ = 0x80016a1;
  auVar29._28_4_ = 0x80016a1;
  do {
    auVar14 = vpermq_avx2(*(undefined1 (*) [32])((long)&local_260 + lVar23),0xd8);
    auVar30 = vpunpcklwd_avx2(auVar14,auVar28);
    auVar14 = vpunpckhwd_avx2(auVar14,auVar28);
    auVar30 = vpmaddwd_avx2(auVar30,auVar29);
    auVar31 = vpsrad_avx2(auVar30,0xc);
    auVar30 = vpmaddwd_avx2(auVar14,auVar29);
    auVar30 = vpsrad_avx2(auVar30,0xc);
    *(undefined1 (*) [32])((long)output + lVar23 * 2) = auVar31;
    *(undefined1 (*) [32])((long)output + lVar23 * 2 + 0x20) = auVar30;
    lVar23 = lVar23 + 0x20;
  } while (lVar23 != 0x100);
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_8x16_avx2(const int16_t *input, int32_t *output,
                                       int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[16], buf1[16];
  __m256i buf2[8];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X16];
  const int txw_idx = get_txw_idx(TX_8X16);
  const int txh_idx = get_txh_idx(TX_8X16);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 8;
  const int height = 16;
  const transform_1d_sse2 col_txfm = col_txfm8x16_arr[tx_type];
  const transform_1d_avx2 row_txfm = row_txfm8x16_arr[tx_type];
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  if (ud_flip) {
    load_buffer_16bit_to_16bit_flip(input, stride, buf0, height);
  } else {
    load_buffer_16bit_to_16bit(input, stride, buf0, height);
  }
  round_shift_16bit(buf0, height, shift[0]);
  col_txfm(buf0, buf0, cos_bit_col);
  round_shift_16bit(buf0, height, shift[1]);
  transpose_16bit_8x8(buf0, buf1);
  transpose_16bit_8x8(buf0 + 8, buf1 + 8);

  __m128i *bufl, *bufu;
  if (lr_flip) {
    bufl = buf0;
    bufu = buf0 + 8;
    flip_buf_sse2(buf1 + width * 0, bufl, width);
    flip_buf_sse2(buf1 + width * 1, bufu, width);
  } else {
    bufl = buf1 + width * 0;
    bufu = buf1 + width * 1;
  }
  pack_reg(bufl, bufu, buf2);
  row_txfm(buf2, buf2, cos_bit_row);
  round_shift_16bit_w16_avx2(buf2, width, shift[2]);
  store_rect_buffer_16bit_to_32bit_w16_avx2(buf2, output, height, width);
}